

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O3

void __thiscall
TPZSkylNSymMatrix<std::complex<double>_>::Read
          (TPZSkylNSymMatrix<std::complex<double>_> *this,TPZStream *buf,void *context)

{
  complex<double> *pcVar1;
  long lVar2;
  long lVar3;
  complex<double> *pcVar4;
  complex<double> *pcVar5;
  TPZVec<int> skyl2;
  TPZVec<int> skyl;
  TPZVec<int> local_68;
  int local_44;
  TPZVec<int> local_40;
  
  TPZBaseMatrix::Read((TPZBaseMatrix *)this,buf,context);
  TPZStream::Read<std::complex<double>>
            (buf,&(this->fStorage).super_TPZVec<std::complex<double>_>,(void *)0x0);
  TPZStream::Read<std::complex<double>>
            (buf,&(this->fStorage).super_TPZVec<std::complex<double>_>,(void *)0x0);
  local_68._vptr_TPZVec = (_func_int **)((ulong)local_68._vptr_TPZVec._4_4_ << 0x20);
  TPZVec<int>::TPZVec(&local_40,
                      (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow + 1,
                      (int *)&local_68);
  local_44 = 0;
  TPZVec<int>::TPZVec(&local_68,
                      (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow + 1,
                      &local_44);
  TPZStream::Read<int>(buf,&local_40,(void *)0x0);
  TPZStream::Read<int>(buf,&local_68,(void *)0x0);
  pcVar1 = (complex<double> *)
           (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  pcVar4 = pcVar1;
  pcVar5 = pcVar1;
  if (pcVar1 != (complex<double> *)0x0) {
    pcVar4 = (this->fStorage).super_TPZVec<std::complex<double>_>.fStore;
    pcVar5 = (this->fStorageb).super_TPZVec<std::complex<double>_>.fStore;
  }
  TPZVec<std::complex<double>_*>::Resize(&this->fElem,(int64_t)(pcVar1->_M_value + 1));
  TPZVec<std::complex<double>_*>::Resize
            (&this->fElemb,
             (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow + 1);
  lVar2 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  if (-1 < lVar2) {
    lVar3 = 0;
    do {
      (this->fElem).fStore[lVar3] = pcVar4 + local_40.fStore[lVar3];
      (this->fElemb).fStore[lVar3] = pcVar5 + local_68.fStore[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 + 1 != lVar3);
  }
  local_68._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  if (local_68.fStore != (int *)0x0) {
    operator_delete__(local_68.fStore);
  }
  local_40._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  if (local_40.fStore != (int *)0x0) {
    operator_delete__(local_40.fStore);
  }
  return;
}

Assistant:

void TPZSkylNSymMatrix<TVar>::Read(TPZStream &buf, void *context )
{
	TPZMatrix<TVar>::Read(buf, context);
	buf.Read( fStorage);
	buf.Read( fStorage);
	TPZVec<int> skyl(this->Rows()+1,0), skyl2(this->Rows()+1,0);
	buf.Read( skyl);
	buf.Read( skyl2);
	TVar *ptr = 0, *ptr2 = 0;
	if (this->Rows()) {
		ptr = &fStorage[0];
		ptr2 = &fStorageb[0];
	}
	fElem.Resize(this->Rows()+1);
	fElemb.Resize(this->Rows()+1);
	for (int64_t i=0; i<this->Rows()+1; i++) {
		fElem[i] = skyl[i] + ptr;
		fElemb[i] = skyl2[i] + ptr2;
	}
}